

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O2

NamedVar * __thiscall
despot::Parser::CreateObsVar(NamedVar *__return_storage_ptr__,Parser *this,TiXmlElement *e_ObsVar)

{
  int num;
  char *__s;
  TiXmlNode *pTVar1;
  string *this_00;
  string value_enum_list;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  values;
  string name;
  allocator<char> local_d9;
  string local_d8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_b8;
  string local_a0;
  string local_80;
  string local_60 [32];
  string local_40 [32];
  
  NamedVar::NamedVar(__return_storage_ptr__);
  __s = util::tinyxml::TiXmlElement::Attribute(e_ObsVar,"vname");
  std::__cxx11::string::string<std::allocator<char>>(local_40,__s,(allocator<char> *)&local_d8);
  std::__cxx11::string::string(local_60,local_40);
  std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name_);
  std::__cxx11::string::~string(local_60);
  pTVar1 = util::tinyxml::TiXmlNode::FirstChild(&e_ObsVar->super_TiXmlNode,"ValueEnum");
  if (pTVar1 == (TiXmlNode *)0x0) {
    GetFirstChildText_abi_cxx11_(&local_d8,this,e_ObsVar,"NumValues");
    num = atoi(local_d8._M_dataplus._M_p);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"o",(allocator<char> *)&local_d8);
    Variable::values(&__return_storage_ptr__->super_Variable,&local_a0,num);
    this_00 = &local_a0;
  }
  else {
    GetFirstChildText_abi_cxx11_(&local_d8,this,e_ObsVar,"ValueEnum");
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_80," ",&local_d9);
    Tokenize(&local_b8,&local_d8,&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    Variable::values(&__return_storage_ptr__->super_Variable,&local_b8);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_b8);
    this_00 = &local_d8;
  }
  std::__cxx11::string::~string((string *)this_00);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

ObsVar Parser::CreateObsVar(TiXmlElement* e_ObsVar) {
	ObsVar obs;

	// <vname>
	string name = e_ObsVar->Attribute("vname");
	obs.name(name);

	// <ValueEnum> or <NumValues>
	if (e_ObsVar->FirstChild("ValueEnum")) {
		string value_enum_list = GetFirstChildText(e_ObsVar, "ValueEnum");
		vector<string> values = Tokenize(value_enum_list);
		obs.values(values);
	} else {
		int num = atoi(GetFirstChildText(e_ObsVar, "NumValues").c_str());
		obs.values("o", num);
	}

	return obs;
}